

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

void __thiscall Fl_Browser::swap(Fl_Browser *this,FL_BLINE *a,FL_BLINE *b)

{
  FL_BLINE *pFVar1;
  FL_BLINE *pFVar2;
  FL_BLINE *pFVar3;
  FL_BLINE *pFVar4;
  FL_BLINE **ppFVar5;
  FL_BLINE *pFVar6;
  
  if (((b != (FL_BLINE *)0x0) && (a != (FL_BLINE *)0x0)) && (a != b)) {
    Fl_Browser_::swapping(&this->super_Fl_Browser_,a,b);
    pFVar1 = a->prev;
    pFVar2 = b->prev;
    pFVar3 = b->next;
    if (pFVar2 == a) {
      ppFVar5 = &pFVar1->next;
      if (pFVar1 == (FL_BLINE *)0x0) {
        ppFVar5 = &this->first;
      }
      *ppFVar5 = b;
      b->next = a;
      a->next = pFVar3;
      b->prev = pFVar1;
      a->prev = b;
      if (pFVar3 == (FL_BLINE *)0x0) {
        this->last = a;
      }
      else {
        pFVar3->prev = a;
      }
    }
    else {
      pFVar4 = a->next;
      if (pFVar1 == b) {
        ppFVar5 = &pFVar2->next;
        if (pFVar2 == (FL_BLINE *)0x0) {
          ppFVar5 = &this->first;
        }
        *ppFVar5 = a;
        a->next = b;
        b->next = pFVar4;
        a->prev = pFVar2;
        b->prev = a;
        if (pFVar4 == (FL_BLINE *)0x0) {
          this->last = b;
        }
        else {
          pFVar4->prev = b;
        }
      }
      else {
        pFVar6 = pFVar4;
        if (pFVar4 == (FL_BLINE *)0x0) {
          pFVar6 = (FL_BLINE *)&this->last;
        }
        b->prev = pFVar1;
        pFVar6->prev = b;
        a->prev = pFVar2;
        pFVar6 = (FL_BLINE *)&this->last;
        if (pFVar3 != (FL_BLINE *)0x0) {
          pFVar6 = pFVar3;
        }
        pFVar6->prev = a;
        ppFVar5 = &pFVar1->next;
        if (pFVar1 == (FL_BLINE *)0x0) {
          ppFVar5 = &this->first;
        }
        *ppFVar5 = b;
        b->next = pFVar4;
        ppFVar5 = &pFVar2->next;
        if (pFVar2 == (FL_BLINE *)0x0) {
          ppFVar5 = &this->first;
        }
        *ppFVar5 = a;
        a->next = pFVar3;
      }
    }
    this->cacheline = 0;
    this->cache = (FL_BLINE *)0x0;
  }
  return;
}

Assistant:

void Fl_Browser::swap(FL_BLINE *a, FL_BLINE *b) {

  if ( a == b || !a || !b) return;          // nothing to do
  swapping(a, b);
  FL_BLINE *aprev  = a->prev;
  FL_BLINE *anext  = a->next;
  FL_BLINE *bprev  = b->prev;
  FL_BLINE *bnext  = b->next;
  if ( b->prev == a ) { 		// A ADJACENT TO B
     if ( aprev ) aprev->next = b; else first = b;
     b->next = a;
     a->next = bnext;
     b->prev = aprev;
     a->prev = b;
     if ( bnext ) bnext->prev = a; else last = a;
  } else if ( a->prev == b ) {		// B ADJACENT TO A
     if ( bprev ) bprev->next = a; else first = a;
     a->next = b;
     b->next = anext;
     a->prev = bprev;
     b->prev = a;
     if ( anext ) anext->prev = b; else last = b;
  } else {				// A AND B NOT ADJACENT
     // handle prev's
     b->prev = aprev;
     if ( anext ) anext->prev = b; else last = b;
     a->prev = bprev;
     if ( bnext ) bnext->prev = a; else last = a;
     // handle next's
     if ( aprev ) aprev->next = b; else first = b;
     b->next = anext;
     if ( bprev ) bprev->next = a; else first = a;
     a->next = bnext;
  }
  // Disable cache -- we played around with positions
  cacheline = 0;
  cache = 0;
}